

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void stbtt_GetPackedQuad(stbtt_packedchar *chardata,int pw,int ph,int char_index,float *xpos,
                        float *ypos,stbtt_aligned_quad *q,int align_to_integer)

{
  ushort *puVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  float *in_R8;
  float *in_R9;
  double dVar2;
  double dVar3;
  float y;
  float x;
  stbtt_packedchar *b;
  float iph;
  float ipw;
  
  puVar1 = (ushort *)(in_RDI + (long)in_ECX * 0x1c);
  if ((int)b == 0) {
    *_y = *in_R8 + *(float *)(puVar1 + 4);
    _y[1] = *in_R9 + *(float *)(puVar1 + 6);
    _y[4] = *in_R8 + *(float *)(puVar1 + 10);
    _y[5] = *in_R9 + *(float *)(puVar1 + 0xc);
  }
  else {
    dVar2 = floor((double)(*in_R8 + *(float *)(puVar1 + 4) + 0.5));
    dVar3 = floor((double)(*in_R9 + *(float *)(puVar1 + 6) + 0.5));
    *_y = (float)(int)dVar2;
    _y[1] = (float)(int)dVar3;
    _y[4] = ((float)(int)dVar2 + *(float *)(puVar1 + 10)) - *(float *)(puVar1 + 4);
    _y[5] = ((float)(int)dVar3 + *(float *)(puVar1 + 0xc)) - *(float *)(puVar1 + 6);
  }
  _y[2] = (float)*puVar1 * (1.0 / (float)in_ESI);
  _y[3] = (float)puVar1[1] * (1.0 / (float)in_EDX);
  _y[6] = (float)puVar1[2] * (1.0 / (float)in_ESI);
  _y[7] = (float)puVar1[3] * (1.0 / (float)in_EDX);
  *in_R8 = *(float *)(puVar1 + 8) + *in_R8;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetPackedQuad(const stbtt_packedchar *chardata, int pw, int ph, int char_index, float *xpos, float *ypos, stbtt_aligned_quad *q, int align_to_integer)
{
float ipw = 1.0f / pw, iph = 1.0f / ph;
const stbtt_packedchar *b = chardata + char_index;

if (align_to_integer) {
float x = (float) STBTT_ifloor((*xpos + b->xoff) + 0.5f);
float y = (float) STBTT_ifloor((*ypos + b->yoff) + 0.5f);
q->x0 = x;
q->y0 = y;
q->x1 = x + b->xoff2 - b->xoff;
q->y1 = y + b->yoff2 - b->yoff;
} else {
q->x0 = *xpos + b->xoff;
q->y0 = *ypos + b->yoff;
q->x1 = *xpos + b->xoff2;
q->y1 = *ypos + b->yoff2;
}

q->s0 = b->x0 * ipw;
q->t0 = b->y0 * iph;
q->s1 = b->x1 * ipw;
q->t1 = b->y1 * iph;

*xpos += b->xadvance;
}